

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.h
# Opt level: O0

void __thiscall
wabt::TypeChecker::PrintStackIfFailed<wabt::Type,wabt::Type>
          (TypeChecker *this,Result result,char *desc,Type args,Type args_1)

{
  initializer_list<wabt::Type> __l;
  char *desc_00;
  bool bVar1;
  allocator<wabt::Type> local_71;
  Type local_70;
  Type local_68;
  iterator local_60;
  size_type local_58;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_50;
  Result local_38;
  Enum local_34;
  char *local_30;
  char *desc_local;
  TypeChecker *this_local;
  Type args_local_1;
  Type args_local;
  Result result_local;
  
  local_34 = result.enum_;
  local_30 = desc;
  desc_local = (char *)this;
  unique0x100000f6 = args_1;
  args_local_1 = args;
  bVar1 = Failed(result);
  desc_00 = local_30;
  if (bVar1) {
    local_70 = args_local_1;
    local_68 = stack0xffffffffffffffe4;
    local_60 = &local_70;
    local_58 = 2;
    local_38.enum_ = result.enum_;
    std::allocator<wabt::Type>::allocator(&local_71);
    __l._M_len = local_58;
    __l._M_array = local_60;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_50,__l,&local_71);
    PrintStackIfFailedV(this,local_38,desc_00,&local_50,false);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_50);
    std::allocator<wabt::Type>::~allocator(&local_71);
  }
  return;
}

Assistant:

void PrintStackIfFailed(Result result, const char* desc, Args... args) {
    // Assert all args are Type or Type::Enum. If it's a TypeVector then
    // PrintStackIfFailedV() should be used instead.
    static_assert((std::is_constructible_v<Type, Args> && ...));
    // Minor optimization, check result before constructing the vector to pass
    // to the other overload of PrintStackIfFailed.
    if (Failed(result)) {
      PrintStackIfFailedV(result, desc, {args...}, /*is_end=*/false);
    }
  }